

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

int __thiscall Bstrlib::CBString::reversefind(CBString *this,char c,int pos)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  
  iVar1 = (this->super_tagbstring).slen;
  if ((pos <= iVar1) && (uVar3 = pos - (uint)(iVar1 == pos), -1 < (int)uVar3)) {
    do {
      if ((this->super_tagbstring).data[uVar3] == c) {
        return uVar3;
      }
      bVar2 = 0 < (int)uVar3;
      uVar3 = uVar3 - 1;
    } while (bVar2);
  }
  return -1;
}

Assistant:

int CBString::reversefind (char c, int pos) const {
	if (pos > slen) return BSTR_ERR;
	if (pos == slen) pos--;
	for (;pos >= 0; pos--) {
		if (data[pos] == (unsigned char) c) return pos;
	}
	return BSTR_ERR;
}